

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_TimedText.cpp
# Opt level: O2

h__Reader * __thiscall
ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource
          (h__Reader *this,FrameBuffer *FrameBuf,AESDecContext *Ctx,HMACContext *HMAC)

{
  Dictionary *this_00;
  h__AESContext *phVar1;
  char cVar2;
  MDDEntry *Ctx_00;
  allocator<char> local_49;
  string local_48 [32];
  
  cVar2 = (**(code **)(**(long **)&(FrameBuf->super_FrameBuffer).m_Capacity + 0x40))();
  if (cVar2 == '\0') {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
  }
  else {
    this_00 = (Dictionary *)(FrameBuf->super_FrameBuffer).m_Data;
    if (this_00 == (Dictionary *)0x0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_TimedText.cpp"
                    ,0xf0,
                    "ASDCP::Result_t ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource(FrameBuffer &, AESDecContext *, HMACContext *)"
                   );
    }
    Ctx_00 = Dictionary::Type(this_00,MDD_TimedTextEssence);
    h__ASDCPReader::ReadEKLVFrame
              (&this->super_h__ASDCPReader,(ui32_t)FrameBuf,(FrameBuffer *)0x0,(byte_t *)Ctx,
               (AESDecContext *)Ctx_00,HMAC);
    if (-1 < *(int *)&(this->super_h__ASDCPReader).
                      super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>.
                      _vptr_TrackFileReader) {
      phVar1 = *(h__AESContext **)&FrameBuf[0x13].super_FrameBuffer.m_FrameNumber;
      Ctx[5].m_Context.m_p = *(h__AESContext **)&FrameBuf[0x13].super_FrameBuffer.m_OwnMem;
      Ctx[6].m_Context.m_p = phVar1;
      std::__cxx11::string::string<std::allocator<char>>(local_48,"text/xml",&local_49);
      std::__cxx11::string::_M_assign((string *)(Ctx + 7));
      std::__cxx11::string::~string(local_48);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::TimedText::MXFReader::h__Reader::ReadTimedTextResource(FrameBuffer& FrameBuf,
							      AESDecContext* Ctx, HMACContext* HMAC)
{
  if ( ! m_File->IsOpen() )
    return RESULT_INIT;

  assert(m_Dict);
  Result_t result = ReadEKLVFrame(0, FrameBuf, m_Dict->ul(MDD_TimedTextEssence), Ctx, HMAC);

 if( ASDCP_SUCCESS(result) )
   {
     FrameBuf.AssetID(m_TDesc.AssetID);
     FrameBuf.MIMEType("text/xml");
   }

 return result;
}